

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_function_t *
gravity_function_new_special
          (gravity_vm *vm,char *identifier,uint16_t index,void *getter,void *setter)

{
  gravity_function_t *pgVar1;
  gravity_function_t *f;
  void *setter_local;
  void *getter_local;
  uint16_t index_local;
  char *identifier_local;
  gravity_vm *vm_local;
  
  pgVar1 = gravity_function_new(vm,identifier,0,0,0,(void *)0x0);
  pgVar1->tag = EXEC_TYPE_SPECIAL;
  (pgVar1->field_9).field_2.index = index;
  (pgVar1->field_9).field_2.special[0] = getter;
  (pgVar1->field_9).field_2.special[1] = setter;
  return pgVar1;
}

Assistant:

gravity_function_t *gravity_function_new_special (gravity_vm *vm, const char *identifier, uint16_t index, void *getter, void *setter) {
    gravity_function_t *f = gravity_function_new(vm, identifier, 0, 0, 0, NULL);
    f->tag = EXEC_TYPE_SPECIAL;
    f->index = index;
    f->special[0] = getter;
    f->special[1] = setter;
    return f;
}